

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleClientProtocolError
          (TestErrorHandler *this,ProtocolError protocolError,Response *response)

{
  char *pcVar1;
  size_t sVar2;
  bool in_R8B;
  String *in_R9;
  ArrayPtr<const_unsigned_char> bytes;
  StringPtr statusText;
  String local_88;
  String local_68;
  String local_48;
  Maybe<kj::HttpService::Response_&> local_28;
  
  bytes.size_ = 0;
  bytes.ptr = (uchar *)protocolError.rawContent.size_;
  kj::_::encodeCEscapeImpl(&local_48,(_ *)protocolError.rawContent.ptr,bytes,in_R8B);
  str<char_const(&)[21],kj::StringPtr&,char_const(&)[16],kj::String>
            (&local_88,(kj *)"Saw protocol error: ",(char (*) [21])&protocolError.description,
             (StringPtr *)"; rawContent = ",(char (*) [16])&local_48,in_R9);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  local_68.content.ptr = local_88.content.ptr;
  local_68.content.size_ = local_88.content.size_;
  local_68.content.disposer = local_88.content.disposer;
  local_88.content.ptr = (char *)0x0;
  local_88.content.size_ = 0;
  statusText.content.size_ = 0xc;
  statusText.content.ptr = "Bad Request";
  sendError(this,400,statusText,&local_68,&local_28);
  sVar2 = local_68.content.size_;
  pcVar1 = local_68.content.ptr;
  if (local_68.content.ptr != (char *)0x0) {
    local_68.content.ptr = (char *)0x0;
    local_68.content.size_ = 0;
    (**(local_68.content.disposer)->_vptr_ArrayDisposer)
              (local_68.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_88.content.size_;
  pcVar1 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleClientProtocolError(
      HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) override {
    // In a real error handler, you should redact `protocolError.rawContent`.
    auto message = kj::str("Saw protocol error: ", protocolError.description, "; rawContent = ",
        encodeCEscape(protocolError.rawContent));
    return sendError(400, "Bad Request", kj::mv(message), response);
  }